

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

adt_error_t adt_str_reserve(adt_str_t *self,int32_t s32NewLen)

{
  int32_t iVar1;
  uint8_t *__dest;
  int32_t s32Size;
  uint8_t *pStr;
  adt_error_t retval;
  int32_t s32NewLen_local;
  adt_str_t *self_local;
  
  pStr._3_1_ = '\0';
  if ((self == (adt_str_t *)0x0) || (s32NewLen < 0)) {
    pStr._3_1_ = '\x01';
  }
  else if (self->s32Size < s32NewLen + 1) {
    iVar1 = adt_str_calcSize(self->s32Size,s32NewLen + 1);
    __dest = (uint8_t *)malloc((long)iVar1);
    if (__dest == (uint8_t *)0x0) {
      pStr._3_1_ = '\x02';
    }
    else {
      if (self->pAlloc != (uint8_t *)0x0) {
        memcpy(__dest,self->pAlloc,(long)self->s32Cur);
        free(self->pAlloc);
      }
      self->pAlloc = __dest;
      self->s32Size = iVar1;
    }
  }
  return pStr._3_1_;
}

Assistant:

adt_error_t adt_str_reserve(adt_str_t *self, int32_t s32NewLen)
{
   adt_error_t retval = ADT_NO_ERROR;

   if ( (self == 0) || (s32NewLen < 0) )
   {
      retval = ADT_INVALID_ARGUMENT_ERROR;
   }
   else
   {
      s32NewLen++; //reserve 1 byte for null terminator
      if (self->s32Size < s32NewLen)
      {
         uint8_t *pStr;
         int32_t s32Size;

         s32Size = adt_str_calcSize(self->s32Size, s32NewLen);
         pStr = (uint8_t*) malloc(s32Size);
         if (pStr == 0)
         {
            retval = ADT_MEM_ERROR;
         }
         else
         {
            if(self->pAlloc != 0)
            {
               memcpy(pStr,self->pAlloc, self->s32Cur);
               free(self->pAlloc);
            }
            self->pAlloc = pStr;
            self->s32Size = s32Size;
         }
      }
   }
   return retval;
}